

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleTypeHandler<3UL>::SetAttributes
          (SimpleTypeHandler<3UL> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyAttributes attributes)

{
  byte bVar1;
  ScriptContext *pSVar2;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  bool bVar3;
  BOOL BVar4;
  BOOL BVar5;
  PropertyId propertyId_00;
  undefined7 in_register_00000009;
  long lVar6;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_50;
  JavascriptLibrary *local_48;
  uint32 local_3c;
  PropertyAttributes PStack_38;
  uint32 indexVal;
  
  if (0 < (long)this->propertyCount) {
    lVar6 = 0;
    do {
      if (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + lVar6) + 8) == propertyId) {
        bVar1 = *(byte *)((long)&this->descriptors[0].field_1 + lVar6);
        if ((bVar1 & 8) != 0) {
          return 1;
        }
        *(byte *)((long)&this->descriptors[0].field_1 + lVar6) = attributes & 7 | bVar1 & 0xf0;
        if ((attributes & 1) != 0) {
          DynamicObject::SetHasNoEnumerableProperties(instance,false);
        }
        local_48 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
        _PStack_38 = &local_48->typesWithOnlyWritablePropertyProtoChain;
        Memory::Recycler::WBSetBit((char *)&local_50);
        local_50 = _PStack_38;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
        this_00 = local_50;
        if ((*(byte *)((long)&this->descriptors[0].field_1 + lVar6) & 4) != 0) {
          return 1;
        }
        pSVar2 = (local_48->super_JavascriptLibraryBase).scriptContext.ptr;
        DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false);
        if (((this->super_DynamicTypeHandler).flags & 0x20) == 0) {
          return 1;
        }
        propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(pSVar2,propertyId);
        ScriptContext::InvalidateStoreFieldCaches(pSVar2,propertyId_00);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_00);
        return 1;
      }
      lVar6 = lVar6 + 0x10;
    } while ((long)this->propertyCount * 0x10 != lVar6);
  }
  _PStack_38 = (PrototypeChainCache<Js::OnlyWritablePropertyCache> *)
               CONCAT44(indexVal,(int)CONCAT71(in_register_00000009,attributes));
  pSVar2 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  bVar3 = DynamicObject::HasObjectArray(instance);
  BVar5 = 1;
  if ((bVar3) &&
     (BVar4 = ScriptContext::IsNumericPropertyId(pSVar2,propertyId,&local_3c), BVar4 != 0)) {
    BVar5 = DynamicTypeHandler::SetItemAttributes
                      (&this->super_DynamicTypeHandler,instance,local_3c,PStack_38);
  }
  return BVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetAttributes(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attributes)
    {
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    return true;
                }

                descriptors[i].Attributes = (descriptors[i].Attributes & ~PropertyDynamicTypeDefaults) | (attributes & PropertyDynamicTypeDefaults);
                if (descriptors[i].Attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptors[i].Attributes, propertyId, library->GetScriptContext());
                return true;
            }
        }

        // Check numeric propertyId only if objectArray available
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::SetItemAttributes(instance, indexVal, attributes);
        }

        return true;
    }